

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

base_uint<160UL,_jbcoin::detail::AccountIDTag> * __thiscall
jbcoin::STObject::
getFieldByValue<jbcoin::STAccount,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
          (base_uint<160UL,_jbcoin::detail::AccountIDTag> *__return_storage_ptr__,STObject *this,
          SField *field)

{
  SField *pSVar1;
  int iVar2;
  STBase *pSVar3;
  
  pSVar3 = peekAtPField(this,field);
  if (pSVar3 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar2 = (*pSVar3->_vptr_STBase[4])(pSVar3);
  if (iVar2 == 0) {
    __return_storage_ptr__->pn[0] = 0;
    __return_storage_ptr__->pn[1] = 0;
    __return_storage_ptr__->pn[2] = 0;
    __return_storage_ptr__->pn[3] = 0;
    __return_storage_ptr__->pn[4] = 0;
  }
  else {
    if (pSVar3->_vptr_STBase != (_func_int **)&PTR__STBase_002f7f40) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    __return_storage_ptr__->pn[4] = *(uint32_t *)&pSVar3[2]._vptr_STBase;
    pSVar1 = pSVar3[1].fName;
    *(_func_int ***)__return_storage_ptr__->pn = pSVar3[1]._vptr_STBase;
    *(SField **)(__return_storage_ptr__->pn + 2) = pSVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }